

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequest.cpp
# Opt level: O3

RawHeadersList *
QNetworkHeadersPrivate::fromHttpToRaw(RawHeadersList *__return_storage_ptr__,QHttpHeaders *headers)

{
  long lVar1;
  long lVar2;
  int iVar3;
  qsizetype qVar4;
  size_t __n;
  Data<QHashPrivate::Node<QByteArray,_long_long>_> *pDVar5;
  pointer ppVar6;
  ulong uVar7;
  char *s;
  long i;
  long in_FS_OFFSET;
  QLatin1StringView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  iterator iVar11;
  RawHeadersList *list;
  QByteArray local_78;
  QHash<QByteArray,_long_long> local_58;
  TryEmplaceResult local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  qVar4 = QHttpHeaders::size(headers);
  if (qVar4 == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_0019c6c6;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (pair<QByteArray,_QByteArray> *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (pair<QByteArray,_QByteArray> *)0x0;
    (__return_storage_ptr__->d).size = 0;
    local_58.d = (Data *)0x0;
    qVar4 = QHttpHeaders::size(headers);
    QList<std::pair<QByteArray,_QByteArray>_>::reserve(__return_storage_ptr__,qVar4);
    qVar4 = QHttpHeaders::size(headers);
    QHash<QByteArray,_long_long>::reserve(&local_58,qVar4);
    qVar4 = QHttpHeaders::size(headers);
    if (0 < qVar4) {
      i = 0;
      do {
        QVar8 = QHttpHeaders::nameAt(headers,i);
        __n = QVar8.m_size;
        QVar9 = QHttpHeaders::valueAt(headers,i);
        QVar10 = QHttpHeaders::wellKnownHeaderName(SetCookie);
        s = ", ";
        if ((__n == QVar10.m_size) && (s = "\n", __n != 0)) {
          iVar3 = bcmp(QVar8.m_data,QVar10.m_data,__n);
          s = ", ";
          if (iVar3 == 0) {
            s = "\n";
          }
        }
        local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_78.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
        QByteArray::QByteArray(&local_78,QVar8.m_data,__n);
        iVar11 = QHash<QByteArray,_long_long>::findImpl<QByteArray>(&local_58,&local_78);
        pDVar5 = iVar11.i.d;
        if (pDVar5 == (Data<QHashPrivate::Node<QByteArray,_long_long>_> *)0x0 &&
            iVar11.i.bucket == 0) {
          qVar4 = (__return_storage_ptr__->d).size;
          QHash<QByteArray,long_long>::tryEmplace_impl<QByteArray_const&>
                    (&local_50,&local_58,&local_78);
          *(qsizetype *)
           ((local_50.iterator.i.d)->spans[local_50.iterator.i.bucket >> 7].entries
            [(local_50.iterator.i.d)->spans[local_50.iterator.i.bucket >> 7].offsets
             [(uint)local_50.iterator.i.bucket & 0x7f]].storage.data + 0x18) = qVar4;
          QByteArray::QByteArray((QByteArray *)&local_50,QVar9.m_data,(longlong)QVar9.m_size);
          QtPrivate::QMovableArrayOps<std::pair<QByteArray,QByteArray>>::
          emplace<QByteArray_const&,QByteArray>
                    ((QMovableArrayOps<std::pair<QByteArray,QByteArray>> *)__return_storage_ptr__,
                     (__return_storage_ptr__->d).size,&local_78,(QByteArray *)&local_50);
          QList<std::pair<QByteArray,_QByteArray>_>::end(__return_storage_ptr__);
          if (local_50.iterator.i.d != (Data<QHashPrivate::Node<QByteArray,_long_long>_> *)0x0) {
            LOCK();
            ((local_50.iterator.i.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
                 ((local_50.iterator.i.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_50.iterator.i.d)->ref).atomic._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate((QArrayData *)local_50.iterator.i.d,1,0x10);
            }
          }
        }
        else {
          lVar2 = (iVar11.i.bucket >> 3 & 0xfffffffffffffff0) * 9;
          uVar7 = (ulong)((uint)iVar11.i.bucket & 0x7f);
          lVar1 = *(long *)(*(long *)(pDVar5->spans->offsets + lVar2 + 0x80) + 0x18 +
                           (ulong)pDVar5->spans->offsets[uVar7 + lVar2] * 0x20);
          ppVar6 = QList<std::pair<QByteArray,_QByteArray>_>::data(__return_storage_ptr__);
          QByteArray::append(&ppVar6[lVar1].second,s,-1);
          lVar1 = *(long *)(*(long *)(pDVar5->spans->offsets + lVar2 + 0x80) + 0x18 +
                           (ulong)pDVar5->spans->offsets[uVar7 + lVar2] * 0x20);
          ppVar6 = QList<std::pair<QByteArray,_QByteArray>_>::data(__return_storage_ptr__);
          QVar9.m_data = (storage_type *)QVar9.m_size;
          QVar9.m_size = ppVar6[lVar1].second.d.size;
          QByteArray::insert((longlong)&ppVar6[lVar1].second,QVar9);
        }
        if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,1,0x10);
          }
        }
        i = i + 1;
        qVar4 = QHttpHeaders::size(headers);
      } while (i < qVar4);
    }
    QHash<QByteArray,_long_long>::~QHash(&local_58);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
LAB_0019c6c6:
      __stack_chk_fail();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QNetworkHeadersPrivate::RawHeadersList QNetworkHeadersPrivate::fromHttpToRaw(
        const QHttpHeaders &headers)
{
    if (headers.isEmpty())
        return {};

    QNetworkHeadersPrivate::RawHeadersList list;
    QHash<QByteArray, qsizetype> nameToIndex;
    list.reserve(headers.size());
    nameToIndex.reserve(headers.size());

    for (qsizetype i = 0; i < headers.size(); ++i) {
        const auto nameL1 = headers.nameAt(i);
        const auto value = headers.valueAt(i);

        const bool isSetCookie = nameL1 == QHttpHeaders::wellKnownHeaderName(
                                         QHttpHeaders::WellKnownHeader::SetCookie);

        const auto name = QByteArray(nameL1.data(), nameL1.size());
        if (auto it = nameToIndex.find(name); it != nameToIndex.end()) {
            list[it.value()].second += isSetCookie ? "\n" : ", ";
            list[it.value()].second += value;
        } else {
            nameToIndex[name] = list.size();
            list.emplaceBack(name, value.toByteArray());
        }
    }

    return list;
}